

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_queue.h
# Opt level: O1

bool __thiscall
webrtc::
SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>::
Insert(SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
       *this,vector<short,_std::allocator<short>_> *input)

{
  string *psVar1;
  pointer pvVar2;
  size_t sVar3;
  pointer psVar4;
  pointer psVar5;
  pointer psVar6;
  string *result;
  string *psVar7;
  ostream *poVar8;
  string *psVar9;
  CritScope cs;
  CritScope CStack_1a8;
  FatalMessage local_1a0;
  
  if (input == (vector<short,_std::allocator<short>_> *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Check failed: input",0x13);
    std::ios::widen((char)(ostream *)&local_1a0 +
                    (char)((string *)(local_1a0._0_8_ + -0x20))->_M_string_length);
    std::ostream::put((char)&local_1a0);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"# ",2);
  }
  else {
    rtc::CritScope::CritScope(&CStack_1a8,&this->crit_queue_);
    if ((ulong)((long)(input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage -
                (long)(input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 1) <
        (this->queue_item_verifier_).minimum_capacity_) {
      rtc::FatalMessage::FatalMessage
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                 ,0x7d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"Check failed: queue_item_verifier_(*input)",0x2a);
      std::ios::widen((char)(ostream *)&local_1a0 +
                      (char)((string *)(local_1a0._0_8_ + -0x20))->_M_string_length);
      std::ostream::put((char)&local_1a0);
      poVar8 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"# ",2);
    }
    else {
      psVar1 = (string *)this->num_elements_;
      pvVar2 = (this->queue_).
               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar9 = (string *)
               (((long)(this->queue_).
                       super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
               -0x5555555555555555);
      if (psVar1 == psVar9) {
LAB_0017c7ba:
        rtc::CritScope::~CritScope(&CStack_1a8);
        return psVar1 != psVar9;
      }
      sVar3 = this->next_write_index_;
      psVar5 = (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      psVar6 = (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      psVar4 = (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_start = pvVar2[sVar3].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)
                   ((long)&pvVar2[sVar3].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data + 8);
      (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           *(pointer *)
            ((long)&pvVar2[sVar3].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data + 0x10);
      pvVar2[sVar3].super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start = psVar5;
      *(pointer *)
       ((long)&pvVar2[sVar3].super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data + 8) = psVar6;
      *(pointer *)
       ((long)&pvVar2[sVar3].super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data + 0x10) = psVar4;
      result = (string *)0x0;
      psVar7 = (string *)(sVar3 + 1);
      if ((string *)(sVar3 + 1) == psVar9) {
        psVar7 = result;
      }
      this->next_write_index_ = (size_t)psVar7;
      this->num_elements_ = (size_t)((long)&(psVar1->_M_dataplus)._M_p + 1);
      local_1a0._0_8_ = psVar9;
      if (psVar9 <= psVar7) {
        result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                           (&this->next_write_index_,(unsigned_long *)&local_1a0,
                            "next_write_index_ < queue_.size()");
      }
      if (result == (string *)0x0) {
        local_1a0._0_8_ =
             ((long)(this->queue_).
                    super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->queue_).
                    super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if ((ulong)local_1a0._0_8_ < (string *)this->num_elements_) {
          psVar7 = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                             (&this->num_elements_,(unsigned_long *)&local_1a0,
                              "num_elements_ <= queue_.size()");
        }
        else {
          psVar7 = (string *)0x0;
        }
        if (psVar7 == (string *)0x0) goto LAB_0017c7ba;
        rtc::FatalMessage::FatalMessage
                  (&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                   ,0x8e,psVar7);
      }
      else {
        rtc::FatalMessage::FatalMessage
                  (&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                   ,0x8d,result);
      }
    }
  }
  rtc::FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

bool Insert(T* input) WARN_UNUSED_RESULT {
    RTC_DCHECK(input);

    rtc::CritScope cs(&crit_queue_);

    RTC_DCHECK(queue_item_verifier_(*input));

    if (num_elements_ == queue_.size()) {
      return false;
    }

    using std::swap;
    swap(*input, queue_[next_write_index_]);

    ++next_write_index_;
    if (next_write_index_ == queue_.size()) {
      next_write_index_ = 0;
    }

    ++num_elements_;

    RTC_DCHECK_LT(next_write_index_, queue_.size());
    RTC_DCHECK_LE(num_elements_, queue_.size());

    return true;
  }